

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

string * __thiscall
QPDFJob::getMessagePrefix_abi_cxx11_(string *__return_storage_ptr__,QPDFJob *this)

{
  element_type *peVar1;
  QPDFJob *this_local;
  
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&peVar1->message_prefix);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::getMessagePrefix() const
{
    return m->message_prefix;
}